

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int freeSpace(MemPage *pPage,u16 iStart,u16 iSize)

{
  ulong uVar1;
  uint uVar2;
  u8 *puVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 uVar7;
  uint uVar8;
  undefined6 in_register_00000012;
  ulong uVar9;
  ulong uVar10;
  undefined6 in_register_00000032;
  ushort uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  byte bVar15;
  ushort uVar16;
  uint uVar17;
  
  uVar10 = CONCAT62(in_register_00000032,iStart);
  uVar9 = CONCAT62(in_register_00000012,iSize) & 0xffffffff;
  iVar4 = (int)CONCAT62(in_register_00000012,iSize);
  uVar14 = (uint)uVar10;
  uVar8 = iVar4 + uVar14;
  puVar3 = pPage->aData;
  uVar6 = (ulong)pPage->hdrOffset;
  uVar1 = uVar6 + 1;
  uVar5 = uVar1;
  if ((puVar3[uVar6 + 2] == '\0') && (puVar3[uVar1] == '\0')) {
    uVar11 = 0;
    uVar12 = uVar1;
  }
  else {
    do {
      uVar12 = uVar5;
      uVar16 = *(ushort *)(puVar3 + uVar12);
      uVar11 = uVar16 << 8 | uVar16 >> 8;
      uVar17 = (uint)uVar11;
      uVar13 = (uint)uVar12;
      if (iStart <= uVar11) goto LAB_00149575;
      uVar5 = (ulong)uVar11;
    } while (uVar13 + 4 <= uVar17);
    if (uVar11 != 0) {
      uVar7 = 0x10c4c;
      goto LAB_001497dd;
    }
LAB_00149575:
    uVar2 = pPage->pBt->usableSize;
    if (uVar2 - 4 < uVar17) {
      uVar7 = 0x10c51;
      goto LAB_001497dd;
    }
    if (uVar8 + 3 < uVar17 || uVar11 == 0) {
      bVar15 = 0;
    }
    else {
      bVar15 = (char)(uVar16 >> 8) - (char)uVar8;
      if (uVar11 < uVar8) {
        uVar7 = 0x10c5d;
        goto LAB_001497dd;
      }
      uVar8 = (ushort)(*(ushort *)(puVar3 + (ulong)uVar11 + 2) << 8 |
                      *(ushort *)(puVar3 + (ulong)uVar11 + 2) >> 8) + uVar17;
      if (uVar2 < uVar8) {
        uVar7 = 0x10c60;
        goto LAB_001497dd;
      }
      uVar9 = (ulong)(uVar8 - uVar14);
      uVar11 = *(ushort *)(puVar3 + uVar11) << 8 | *(ushort *)(puVar3 + uVar11) >> 8;
    }
    if (((uint)uVar1 < uVar13) &&
       (uVar16 = *(ushort *)(puVar3 + uVar12 + 2) << 8 | *(ushort *)(puVar3 + uVar12 + 2) >> 8,
       uVar14 <= uVar16 + uVar13 + 3)) {
      uVar17 = uVar16 + uVar13;
      if (uVar14 < uVar17) {
        uVar7 = 0x10c6d;
        goto LAB_001497dd;
      }
      bVar15 = bVar15 + ((char)iStart - (char)uVar17);
      uVar9 = (ulong)(uVar8 - uVar13);
      uVar10 = uVar12;
    }
    if (puVar3[uVar6 + 7] < bVar15) {
      uVar7 = 0x10c73;
      goto LAB_001497dd;
    }
    puVar3[uVar6 + 7] = puVar3[uVar6 + 7] - bVar15;
    uVar14 = (uint)uVar10 & 0xffff;
  }
  uVar13 = (uint)(ushort)(*(ushort *)(puVar3 + uVar6 + 5) << 8 |
                         *(ushort *)(puVar3 + uVar6 + 5) >> 8);
  if (uVar14 <= uVar13) {
    if (uVar14 < uVar13) {
      uVar7 = 0x10c7c;
    }
    else {
      if ((uint)uVar1 == (uint)uVar12) {
        *(ushort *)(puVar3 + uVar1) = uVar11 << 8 | uVar11 >> 8;
        puVar3[uVar6 + 5] = (u8)(uVar8 >> 8);
        puVar3[uVar6 + 6] = (u8)uVar8;
        goto LAB_0014972f;
      }
      uVar7 = 0x10c7d;
    }
LAB_001497dd:
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar7,
                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
    return 0xb;
  }
  *(ushort *)(puVar3 + uVar12) = (ushort)uVar10 << 8 | (ushort)uVar10 >> 8;
LAB_0014972f:
  uVar10 = uVar10 & 0xffff;
  if ((pPage->pBt->btsFlags & 0xc) != 0) {
    memset(puVar3 + uVar10,0,uVar9 & 0xffff);
  }
  puVar3[uVar10] = (u8)(uVar11 >> 8);
  puVar3[uVar10 + 1] = (u8)uVar11;
  puVar3[uVar10 + 2] = (u8)(uVar9 >> 8);
  puVar3[uVar10 + 3] = (u8)uVar9;
  pPage->nFree = pPage->nFree + iVar4;
  return 0;
}

Assistant:

static int freeSpace(MemPage *pPage, u16 iStart, u16 iSize){
  u16 iPtr;                             /* Address of ptr to next freeblock */
  u16 iFreeBlk;                         /* Address of the next freeblock */
  u8 hdr;                               /* Page header size.  0 or 100 */
  u8 nFrag = 0;                         /* Reduction in fragmentation */
  u16 iOrigSize = iSize;                /* Original value of iSize */
  u16 x;                                /* Offset to cell content area */
  u32 iEnd = iStart + iSize;            /* First byte past the iStart buffer */
  unsigned char *data = pPage->aData;   /* Page content */
  u8 *pTmp;                             /* Temporary ptr into data[] */

  assert( pPage->pBt!=0 );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( CORRUPT_DB || iStart>=pPage->hdrOffset+6+pPage->childPtrSize );
  assert( CORRUPT_DB || iEnd <= pPage->pBt->usableSize );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( iSize>=4 );   /* Minimum cell size is 4 */
  assert( iStart<=pPage->pBt->usableSize-4 );

  /* The list of freeblocks must be in ascending order.  Find the
  ** spot on the list where iStart should be inserted.
  */
  hdr = pPage->hdrOffset;
  iPtr = hdr + 1;
  if( data[iPtr+1]==0 && data[iPtr]==0 ){
    iFreeBlk = 0;  /* Shortcut for the case when the freelist is empty */
  }else{
    while( (iFreeBlk = get2byte(&data[iPtr]))<iStart ){
      if( iFreeBlk<iPtr+4 ){
        if( iFreeBlk==0 ) break; /* TH3: corrupt082.100 */
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iPtr = iFreeBlk;
    }
    if( iFreeBlk>pPage->pBt->usableSize-4 ){ /* TH3: corrupt081.100 */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( iFreeBlk>iPtr || iFreeBlk==0 || CORRUPT_DB );

    /* At this point:
    **    iFreeBlk:   First freeblock after iStart, or zero if none
    **    iPtr:       The address of a pointer to iFreeBlk
    **
    ** Check to see if iFreeBlk should be coalesced onto the end of iStart.
    */
    if( iFreeBlk && iEnd+3>=iFreeBlk ){
      nFrag = iFreeBlk - iEnd;
      if( iEnd>iFreeBlk ) return SQLITE_CORRUPT_PAGE(pPage);
      iEnd = iFreeBlk + get2byte(&data[iFreeBlk+2]);
      if( iEnd > pPage->pBt->usableSize ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iSize = iEnd - iStart;
      iFreeBlk = get2byte(&data[iFreeBlk]);
    }

    /* If iPtr is another freeblock (that is, if iPtr is not the freelist
    ** pointer in the page header) then check to see if iStart should be
    ** coalesced onto the end of iPtr.
    */
    if( iPtr>hdr+1 ){
      int iPtrEnd = iPtr + get2byte(&data[iPtr+2]);
      if( iPtrEnd+3>=iStart ){
        if( iPtrEnd>iStart ) return SQLITE_CORRUPT_PAGE(pPage);
        nFrag += iStart - iPtrEnd;
        iSize = iEnd - iPtr;
        iStart = iPtr;
      }
    }
    if( nFrag>data[hdr+7] ) return SQLITE_CORRUPT_PAGE(pPage);
    data[hdr+7] -= nFrag;
  }
  pTmp = &data[hdr+5];
  x = get2byte(pTmp);
  if( iStart<=x ){
    /* The new freeblock is at the beginning of the cell content area,
    ** so just extend the cell content area rather than create another
    ** freelist entry */
    if( iStart<x ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iPtr!=hdr+1 ) return SQLITE_CORRUPT_PAGE(pPage);
    put2byte(&data[hdr+1], iFreeBlk);
    put2byte(&data[hdr+5], iEnd);
  }else{
    /* Insert the new freeblock into the freelist */
    put2byte(&data[iPtr], iStart);
  }
  if( pPage->pBt->btsFlags & BTS_FAST_SECURE ){
    /* Overwrite deleted information with zeros when the secure_delete
    ** option is enabled */
    memset(&data[iStart], 0, iSize);
  }
  put2byte(&data[iStart], iFreeBlk);
  put2byte(&data[iStart+2], iSize);
  pPage->nFree += iOrigSize;
  return SQLITE_OK;
}